

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O0

int rpm_bidder_init(archive_read_filter *self)

{
  void *pvVar1;
  rpm *rpm;
  archive_read_filter *self_local;
  
  self->code = 8;
  self->name = "rpm";
  pvVar1 = calloc(0x30,1);
  if (pvVar1 == (void *)0x0) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for rpm");
    self_local._4_4_ = -0x1e;
  }
  else {
    self->data = pvVar1;
    *(undefined4 *)((long)pvVar1 + 0x28) = 0;
    self->vtable = &rpm_reader_vtable;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
rpm_bidder_init(struct archive_read_filter *self)
{
	struct rpm   *rpm;

	self->code = ARCHIVE_FILTER_RPM;
	self->name = "rpm";

	rpm = (struct rpm *)calloc(sizeof(*rpm), 1);
	if (rpm == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for rpm");
		return (ARCHIVE_FATAL);
	}

	self->data = rpm;
	rpm->state = ST_LEAD;
	self->vtable = &rpm_reader_vtable;

	return (ARCHIVE_OK);
}